

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Reset(BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->bucketCount == 0) {
    if (this->buckets != (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x147,"(!buckets)","!buckets");
      if (!bVar2) goto LAB_00b0055b;
      *puVar3 = 0;
    }
  }
  else {
    DeleteBuckets(this,this->buckets,this->bucketCount);
    this->buckets = (Type)0x0;
    this->bucketCount = 0;
    this->modFunctionIndex = 0x4b;
  }
  if (this->size == 0) {
    if (this->entries != (EntryType *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x152,"(!entries)","!entries");
      if (!bVar2) goto LAB_00b0055b;
      *puVar3 = 0;
    }
    if (this->count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x153,"(count == 0)","count == 0");
      if (!bVar2) goto LAB_00b0055b;
      *puVar3 = 0;
    }
    if (this->freeCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x154,"(freeCount == 0)","freeCount == 0");
      if (!bVar2) {
LAB_00b0055b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    DeleteEntries(this,this->entries,this->size);
    this->entries = (Type)0x0;
    this->size = 0;
    this->count = 0;
    this->freeCount = 0;
    this->modFunctionIndex = 0x4b;
  }
  return;
}

Assistant:

void Reset()
        {
            if(bucketCount != 0)
            {
                DeleteBuckets(buckets, bucketCount);
                buckets = nullptr;
                bucketCount = 0;
                this->modFunctionIndex = UNKNOWN_MOD_INDEX;
            }
            else
            {
                Assert(!buckets);
            }
            if(size != 0)
            {
                DeleteEntries(entries, size);
                entries = nullptr;
                freeCount = count = size = 0;
                this->modFunctionIndex = UNKNOWN_MOD_INDEX;
            }
            else
            {
                Assert(!entries);
                Assert(count == 0);
                Assert(freeCount == 0);
            }
        }